

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_comm.cpp
# Opt level: O0

Future<int> * __thiscall
Omega_h::Comm::ialltoallv<int>
          (Future<int> *__return_storage_ptr__,Comm *this,Read<int> *sendbuf_dev,
          Read<int> *sdispls_dev,Read<int> *rdispls_dev,Int width)

{
  Read<int> local_48;
  ScopedTimer local_35;
  Int local_34;
  ScopedTimer timer;
  Read<int> *pRStack_30;
  Int width_local;
  Read<int> *rdispls_dev_local;
  Read<int> *sdispls_dev_local;
  Read<int> *sendbuf_dev_local;
  Comm *this_local;
  
  local_34 = width;
  pRStack_30 = rdispls_dev;
  ScopedTimer::ScopedTimer(&local_35,"Comm::ialltoallv",(char *)0x0);
  Read<int>::Read(&local_48,sendbuf_dev);
  Future<int>::Future(__return_storage_ptr__,&local_48);
  Read<int>::~Read(&local_48);
  ScopedTimer::~ScopedTimer(&local_35);
  return __return_storage_ptr__;
}

Assistant:

Future<T> Comm::ialltoallv(Read<T> sendbuf_dev, Read<LO> sdispls_dev,
    Read<LO> rdispls_dev, Int width) const {
  ScopedTimer timer("Comm::ialltoallv");
#ifdef OMEGA_H_USE_MPI
#if defined(OMEGA_H_USE_CUDA) && !defined(OMEGA_H_USE_CUDA_AWARE_MPI)
  auto self_data = self_send_part1(self_dst_, self_src_, &sendbuf_dev,
      &sdispls_dev, &rdispls_dev, width, library_->self_send_threshold());
#endif
  HostRead<LO> sdispls(sdispls_dev);
  HostRead<LO> rdispls(rdispls_dev);
  OMEGA_H_CHECK(sendbuf_dev.size() == sdispls.last() * width);
  int nrecvd = rdispls.last() * width;
#if defined(OMEGA_H_USE_CUDA) && !defined(OMEGA_H_USE_CUDA_AWARE_MPI)
  HostWrite<T> recvbuf(nrecvd);
  HostRead<T> sendbuf(sendbuf_dev);
  OMEGA_H_CHECK(recvbuf.size() == rdispls.last() * width);
  auto reqs = Neighbor_ialltoallv(host_srcs_, host_dsts_, width,
      nonnull(sendbuf.data()), nonnull(sdispls.data()),
      MpiTraits<T>::datatype(), nonnull(recvbuf.data()),
      nonnull(rdispls.data()), MpiTraits<T>::datatype(), impl_);
  auto callback = [=](HostWrite<T> buf) -> Read<T> {
    auto recvbuf_dev = Read<T>(buf.write());
    self_send_part2(self_data, self_src_, &recvbuf_dev, rdispls_dev, width);
    return recvbuf_dev;
  };
  return {sendbuf, recvbuf, std::move(reqs), callback};
#else   // !defined(OMEGA_H_USE_CUDA) || defined(OMEGA_H_USE_CUDA_AWARE_MPI)
  Write<T> recvbuf_dev_w(nrecvd);
  OMEGA_H_CHECK(recvbuf_dev_w.size() == rdispls.last() * width);
  auto reqs = Neighbor_ialltoallv(host_srcs_, host_dsts_, width,
      nonnull(sendbuf_dev.data()), nonnull(sdispls.data()),
      MpiTraits<T>::datatype(), nonnull(recvbuf_dev_w.data()),
      nonnull(rdispls.data()), MpiTraits<T>::datatype(), impl_,
      sendbuf_dev.size(), recvbuf_dev_w.size());
  return {sendbuf_dev, recvbuf_dev_w, std::move(reqs)};
#endif  // !defined(OMEGA_H_USE_CUDA) || defined(OMEGA_H_USE_CUDA_AWARE_MPI)
#else   // !defined(OMEGA_H_USE_MPI)
  (void)sdispls_dev;
  (void)rdispls_dev;
  (void)width;
  return Future<T>(sendbuf_dev);
#endif  // !defined(OMEGA_H_USE_MPI)
}